

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurse.cpp
# Opt level: O0

Nurse * __thiscall Nurse::Day_Getter_abi_cxx11_(Nurse *this)

{
  long in_RSI;
  Nurse *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0xe0));
  return this;
}

Assistant:

string Nurse ::Day_Getter(){
    return Day;
}